

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::Renderer::throwOnInvalidSelectedCardIndex
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex)

{
  optional<unsigned_int> *__lhs;
  bool bVar1;
  runtime_error *this_00;
  uint *puVar2;
  __optional_ge_t<unsigned_int,_unsigned_long> local_35;
  size_type local_28;
  optional<unsigned_int> *local_20;
  SelectedCardIndex *selectedCardIndex_local;
  Cards *pileCards_local;
  Renderer *this_local;
  
  local_20 = selectedCardIndex;
  selectedCardIndex_local = (SelectedCardIndex *)pileCards;
  pileCards_local = (Cards *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)selectedCardIndex);
  __lhs = local_20;
  local_35 = false;
  if (bVar1) {
    local_28 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                         ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *
                          )selectedCardIndex_local);
    local_35 = std::operator>=(__lhs,&local_28);
  }
  if (local_35 != false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar2 = std::optional<unsigned_int>::value(local_20);
    std::runtime_error::runtime_error(this_00,"Cannot get Stock pile card with index: " + *puVar2);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Renderer::throwOnInvalidSelectedCardIndex(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex) const
{
    if (selectedCardIndex and selectedCardIndex >= pileCards.size())
        throw std::runtime_error {
            "Cannot get Stock pile card with index: " + selectedCardIndex.value()};
}